

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::VariableSymbol::serializeTo(VariableSymbol *this,ASTSerializer *serializer)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  ASTSerializer *in_RSI;
  long in_RDI;
  string str;
  bitmask<slang::ast::VariableFlags> *in_stack_ffffffffffffff28;
  ASTSerializer *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  char *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  int local_80;
  void *local_78;
  bitmask<slang::ast::VariableFlags> local_6e;
  bitmask<slang::ast::VariableFlags> local_6c;
  bitmask<slang::ast::VariableFlags> local_6a;
  bitmask<slang::ast::VariableFlags> local_68;
  bitmask<slang::ast::VariableFlags> local_66 [10];
  bitmask<slang::ast::VariableFlags> local_52;
  char local_50 [32];
  string_view local_30;
  int local_20;
  void *local_18;
  ASTSerializer *local_10;
  
  local_10 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  local_30 = ast::toString(Automatic);
  ASTSerializer::write(in_RSI,local_20,local_18,local_30._M_len);
  bVar1 = slang::bitmask::operator_cast_to_bool((bitmask<slang::ast::VariableFlags> *)0x55dbd0);
  if (bVar1) {
    std::__cxx11::string::string(in_stack_ffffffffffffff40);
    bitmask<slang::ast::VariableFlags>::bitmask(&local_52,Const);
    bVar1 = bitmask<slang::ast::VariableFlags>::has
                      ((bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    }
    bitmask<slang::ast::VariableFlags>::bitmask(local_66,CompilerGenerated);
    bVar1 = bitmask<slang::ast::VariableFlags>::has
                      ((bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    }
    bitmask<slang::ast::VariableFlags>::bitmask(&local_68,ImmutableCoverageOption);
    bVar1 = bitmask<slang::ast::VariableFlags>::has
                      ((bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    }
    bitmask<slang::ast::VariableFlags>::bitmask(&local_6a,CoverageSampleFormal);
    bVar1 = bitmask<slang::ast::VariableFlags>::has
                      ((bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    }
    bitmask<slang::ast::VariableFlags>::bitmask(&local_6c,CheckerFreeVariable);
    bVar1 = bitmask<slang::ast::VariableFlags>::has
                      ((bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    }
    this_00 = (basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x154);
    bitmask<slang::ast::VariableFlags>::bitmask(&local_6e,RefStatic);
    bVar1 = bitmask<slang::ast::VariableFlags>::has
                      ((bitmask<slang::ast::VariableFlags> *)in_stack_ffffffffffffff30,
                       in_stack_ffffffffffffff28);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x55dde1
                      );
    if (!bVar1) {
      __str = local_50;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff30);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,__str);
      ASTSerializer::write(local_10,local_80,local_78,(size_t)__str);
      in_stack_ffffffffffffff30 = local_10;
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void VariableSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("lifetime", toString(lifetime));

    if (flags) {
        std::string str;
        if (flags.has(VariableFlags::Const))
            str += "const,";
        if (flags.has(VariableFlags::CompilerGenerated))
            str += "compiler_generated,";
        if (flags.has(VariableFlags::ImmutableCoverageOption))
            str += "imm_cov_option,";
        if (flags.has(VariableFlags::CoverageSampleFormal))
            str += "formal_cov_sample,";
        if (flags.has(VariableFlags::CheckerFreeVariable))
            str += "checker_free,";
        if (flags.has(VariableFlags::RefStatic))
            str += "ref_static,";
        if (!str.empty()) {
            str.pop_back();
            serializer.write("flags", str);
        }
    }
}